

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vup(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  MemOp_conflict MVar6;
  TCGv_i64 dst;
  MemOp_conflict MVar7;
  bool bVar8;
  TCGv_i64 tmp;
  int src_idx;
  int dst_idx;
  uint8_t dst_es;
  uint8_t src_es;
  uint8_t v2;
  uint8_t v1;
  _Bool logical;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar8 = true;
  if ((*(uint *)&(s->fields).field_0x8 >> 8 & 0xff) != 0xd4) {
    bVar8 = (*(uint *)&(s->fields).field_0x8 >> 8 & 0xff) == 0xd5;
  }
  uVar4 = get_field1(s,FLD_O_v1,FLD_C_b1);
  iVar5 = get_field1(s,FLD_O_v2,FLD_C_d4);
  MVar6 = get_field1(s,FLD_O_m3,FLD_C_i3);
  bVar2 = (byte)MVar6;
  bVar3 = bVar2 + 1;
  if (bVar2 < 3) {
    dst = tcg_temp_new_i64(tcg_ctx_00);
    if (((*(uint *)&(s->fields).field_0x8 >> 8 & 0xff) == 0xd7) ||
       ((*(uint *)&(s->fields).field_0x8 >> 8 & 0xff) == 0xd5)) {
      tmp._4_4_ = (int)(0x10 / (long)(1 << (bVar3 & 0x1f)));
      while (tmp._4_4_ = tmp._4_4_ + -1, -1 < tmp._4_4_) {
        MVar7 = MO_ASHIFT;
        if (bVar8) {
          MVar7 = MO_8;
        }
        read_vec_element_i64(tcg_ctx_00,dst,(uint8_t)iVar5,(uint8_t)tmp._4_4_,MVar6 & 0xff | MVar7);
        write_vec_element_i64(tcg_ctx_00,dst,uVar4 & 0xff,(uint8_t)tmp._4_4_,(uint)bVar3);
      }
    }
    else {
      for (tmp._4_4_ = 0; tmp._4_4_ < (int)(0x10 / (long)(1 << (bVar3 & 0x1f)));
          tmp._4_4_ = tmp._4_4_ + 1) {
        uVar1 = 0x10 / (long)(1 << (bVar2 & 0x1f));
        MVar7 = MO_ASHIFT;
        if (bVar8) {
          MVar7 = MO_8;
        }
        read_vec_element_i64
                  (tcg_ctx_00,dst,(uint8_t)iVar5,
                   (uint8_t)tmp._4_4_ +
                   (char)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2
                         ),MVar6 & 0xff | MVar7);
        write_vec_element_i64(tcg_ctx_00,dst,uVar4 & 0xff,(uint8_t)tmp._4_4_,(uint)bVar3);
      }
    }
    tcg_temp_free_i64(tcg_ctx_00,dst);
    s_local._4_4_ = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vup(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const bool logical = s->fields.op2 == 0xd4 || s->fields.op2 == 0xd5;
    const uint8_t v1 = get_field(s, v1);
    const uint8_t v2 = get_field(s, v2);
    const uint8_t src_es = get_field(s, m3);
    const uint8_t dst_es = src_es + 1;
    int dst_idx, src_idx;
    TCGv_i64 tmp;

    if (src_es > ES_32) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    tmp = tcg_temp_new_i64(tcg_ctx);
    if (s->fields.op2 == 0xd7 || s->fields.op2 == 0xd5) {
        /* iterate backwards to avoid overwriting data we might need later */
        for (dst_idx = NUM_VEC_ELEMENTS(dst_es) - 1; dst_idx >= 0; dst_idx--) {
            src_idx = dst_idx;
            read_vec_element_i64(tcg_ctx, tmp, v2, src_idx,
                                 src_es | (logical ? 0 : MO_SIGN));
            write_vec_element_i64(tcg_ctx, tmp, v1, dst_idx, dst_es);
        }

    } else {
        /* iterate forward to avoid overwriting data we might need later */
        for (dst_idx = 0; dst_idx < NUM_VEC_ELEMENTS(dst_es); dst_idx++) {
            src_idx = dst_idx + NUM_VEC_ELEMENTS(src_es) / 2;
            read_vec_element_i64(tcg_ctx, tmp, v2, src_idx,
                                 src_es | (logical ? 0 : MO_SIGN));
            write_vec_element_i64(tcg_ctx, tmp, v1, dst_idx, dst_es);
        }
    }
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}